

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void * hash_table_new_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int extraout_EAX;
  uint uVar5;
  size_t sVar6;
  hash_table_bucket_t *phVar7;
  void *pvVar8;
  undefined4 extraout_var;
  ulong uVar10;
  ulong uVar11;
  hash_table_bucket_t *phVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  hash_table_bucket_t **pphVar19;
  uint uVar20;
  void *unaff_R15;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  void *pvVar9;
  
  dVar21 = ((double)table->n_items + 1.0) / (double)table->n_buckets;
  if (table->max_load <= dVar21 && dVar21 != table->max_load) {
    hash_table_increase_buckets(table);
  }
  iVar14 = 0;
  do {
    sVar1 = (table->ghash).mult;
    sVar6 = (*table->hash)(key);
    pphVar19 = &table->buckets
                [sVar6 * sVar1 + (table->ghash).add >> (-(char)(table->ghash).log2_buckets & 0x3fU)
                 & 0xffffffff].next;
    uVar20 = 0;
    for (phVar7 = *pphVar19; phVar7 != (hash_table_bucket_t *)0x0; phVar7 = phVar7->next) {
      iVar4 = (*table->is_equal)(key,phVar7->data);
      if (iVar4 != 0) {
        unaff_R15 = (*pphVar19)->data;
        iVar4 = 1;
        goto LAB_0010eb45;
      }
      uVar20 = uVar20 + 1;
      phVar7 = *pphVar19;
      pphVar19 = &phVar7->next;
    }
    iVar4 = 7;
    if (table->max_collisions < uVar20) {
      hash_table_increase_buckets(table);
      iVar4 = 0;
    }
LAB_0010eb45:
    if (iVar4 != 0) goto LAB_0010eb59;
    iVar14 = iVar14 + 1;
  } while (iVar14 != 5);
  hash_table_new_item_cold_2();
  iVar4 = extraout_EAX;
LAB_0010eb59:
  if (iVar4 == 7) {
    if (table->free_buckets == (hash_table_bucket_t *)0x0) {
      uVar20 = table->n_buckets;
      uVar10 = (ulong)uVar20;
      phVar7 = (hash_table_bucket_t *)calloc(uVar10,0x10);
      if (phVar7 == (hash_table_bucket_t *)0x0) {
        hash_table_new_item_cold_1();
        iVar14 = *(int *)(uVar10 + 4);
        if (iVar14 == 0) {
          __assert_fail("table->n_buckets > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/util.c"
                        ,0xfe,"void hash_table_increase_buckets(hash_table_t *)");
        }
        uVar11 = (ulong)(iVar14 * 2 + 1);
        uVar16 = 0x10;
        pvVar8 = calloc(uVar11,0x10);
        if (pvVar8 == (void *)0x0) {
          hash_table_increase_buckets_cold_1();
          lVar15 = *(long *)(uVar11 + 0x38);
          lVar18 = (**(code **)(uVar11 + 0x28))(uVar16);
          puVar3 = *(undefined8 **)
                    (*(long *)(uVar11 + 8) + 8 +
                    ((ulong)(lVar18 * lVar15 + *(long *)(uVar11 + 0x40)) >>
                     (-*(char *)(uVar11 + 0x48) & 0x3fU) & 0xffffffff) * 0x10);
          while( true ) {
            if (puVar3 == (undefined8 *)0x0) {
              return (void *)0x0;
            }
            iVar14 = (**(code **)(uVar11 + 0x20))(uVar16,*puVar3);
            if (iVar14 != 0) break;
            puVar3 = (undefined8 *)puVar3[1];
          }
          return (void *)*puVar3;
        }
        *(undefined8 *)((long)pvVar8 + 8) = *(undefined8 *)(uVar10 + 0x18);
        *(void **)(uVar10 + 0x18) = pvVar8;
        lVar15 = *(long *)(uVar10 + 0x30) * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        auVar22._8_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar22._0_8_ = lVar15;
        auVar22._12_4_ = 0x45300000;
        dVar21 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) *
                 5.421010862427522e-20 * 1.8446744073709552e+19;
        uVar17 = (ulong)dVar21;
        uVar17 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar17 >> 0x3f | uVar17;
        lVar15 = lVar15 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        auVar23._8_4_ = (int)((ulong)lVar15 >> 0x20);
        auVar23._0_8_ = lVar15;
        auVar23._12_4_ = 0x45300000;
        dVar21 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) *
                 5.421010862427522e-20 * 1.8446744073709552e+19;
        uVar11 = (ulong)dVar21;
        *(long *)(uVar10 + 0x30) = lVar15;
        uVar11 = (long)(dVar21 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11;
        uVar5 = uint32_log2(iVar14 * 2);
        pvVar9 = (void *)CONCAT44(extraout_var,uVar5);
        uVar20 = *(uint *)(uVar10 + 4);
        if (uVar20 != 0) {
          uVar13 = 0;
          do {
            puVar3 = *(undefined8 **)(*(long *)(uVar10 + 8) + 8 + uVar13 * 0x10);
            while (puVar3 != (undefined8 *)0x0) {
              puVar2 = (undefined8 *)puVar3[1];
              lVar15 = (**(code **)(uVar10 + 0x28))(*puVar3);
              lVar15 = (lVar15 * uVar17 + uVar11 >> (0x40U - (char)uVar5 & 0x3f) & 0xffffffff) *
                       0x10;
              puVar3[1] = *(undefined8 *)((long)pvVar8 + lVar15 + 0x18);
              *(undefined8 **)((long)pvVar8 + lVar15 + 0x18) = puVar3;
              puVar3 = puVar2;
            }
            uVar13 = uVar13 + 1;
            uVar20 = *(uint *)(uVar10 + 4);
          } while (uVar13 < uVar20);
          pvVar9 = (void *)(ulong)uVar5;
        }
        uVar20 = uVar20 - 1;
        if (uVar20 != 0) {
          uVar13 = (ulong)uVar20;
          puVar3 = *(undefined8 **)(uVar10 + 8);
          do {
            puVar3[1] = puVar3 + 2;
            *puVar3 = 0;
            uVar13 = uVar13 - 1;
            puVar3 = puVar3 + 2;
          } while (uVar13 != 0);
        }
        lVar15 = *(long *)(uVar10 + 8);
        lVar18 = (ulong)uVar20 * 0x10;
        *(undefined8 *)(lVar15 + 8 + lVar18) = *(undefined8 *)(uVar10 + 0x10);
        *(undefined8 *)(lVar15 + lVar18) = 0;
        *(long *)(uVar10 + 0x10) = lVar15;
        *(long *)(uVar10 + 8) = (long)pvVar8 + 0x10;
        *(int *)(uVar10 + 4) = iVar14 * 2;
        *(ulong *)(uVar10 + 0x38) = uVar17;
        *(ulong *)(uVar10 + 0x40) = uVar11;
        *(int *)(uVar10 + 0x48) = (int)pvVar9;
        return pvVar9;
      }
      phVar7->next = table->allocs;
      table->allocs = phVar7;
      uVar20 = uVar20 - 1;
      uVar10 = (ulong)uVar20;
      if (1 < uVar20) {
        phVar12 = phVar7 + 2;
        lVar15 = uVar10 - 1;
        do {
          phVar12[-1].next = phVar12;
          phVar12[-1].data = (void *)0x0;
          phVar12 = phVar12 + 1;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      phVar7[uVar10].next = (hash_table_bucket_t *)0x0;
      phVar7[uVar10].data = (void *)0x0;
      table->free_buckets = phVar7 + 1;
    }
    phVar7 = table->free_buckets;
    table->free_buckets = phVar7->next;
    phVar7->data = (void *)0x0;
    phVar7->next = (hash_table_bucket_t *)0x0;
    *pphVar19 = phVar7;
    phVar7->data = key;
    table->n_items = table->n_items + 1;
    unaff_R15 = (*pphVar19)->data;
  }
  return unaff_R15;
}

Assistant:

void * hash_table_new_item( hash_table_t * table, void * key )
{
    int try;
    double load = (table->n_items + 1.0)/table->n_buckets;
    hash_table_bucket_t ** b;
    hash_table_bucket_t * new_bucket;

    if (load > table->max_load)
        hash_table_increase_buckets( table );

    for ( try = 0; try < 5; ++try ) {
        unsigned collisions = 0;
        unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
        b = & table->buckets[i].next;
        
        while (*b) {
            if ( (*table->is_equal)(key, (*b)->data) )
                return (*b)->data;
            collisions += 1;
            b = &(*b)->next;
        }

        if ( collisions > table->max_collisions ) 
            hash_table_increase_buckets( table );
        else
            goto found_item;
    }

    fprintf(stderr, "hash_table_new_item: Beaten by the odds; "
            "too many rehashes\n");
    abort();

found_item:

    if ( table->free_buckets == NULL )
        hash_table_increase_free_buckets( table );

    /* pop a free bucket from the free list */
    new_bucket = table->free_buckets;
    table->free_buckets = table->free_buckets->next;
    new_bucket->next = NULL;
    new_bucket->data = NULL;

    /* append it to the end of the bucket list */
    *b = new_bucket;
    (*b)->data = key;
    table->n_items += 1;
    return (*b)->data;
}